

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiWindow *pIVar1;
  ImGuiColumns *pIVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                  ,0x1f33,"void ImGui::Columns(int, const char *, bool)");
  }
  pIVar2 = (pIVar1->DC).CurrentColumns;
  if (pIVar2 != (ImGuiColumns *)0x0) {
    if ((pIVar2->Count == columns_count) && (pIVar2->Flags == (uint)!border)) {
      return;
    }
    EndColumns();
  }
  if (columns_count == 1) {
    return;
  }
  BeginColumns(id,columns_count,(uint)!border);
  return;
}

Assistant:

bool ImGui::DragFloat2(const char* label, float v[2], float v_speed, float v_min, float v_max, const char* format, float power)
{
    return DragScalarN(label, ImGuiDataType_Float, v, 2, v_speed, &v_min, &v_max, format, power);
}